

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::LifetimeTests::details::ResultCollector::addResult
          (ResultCollector *this,qpTestResult result,char *msg)

{
  size_t sVar1;
  bool bVar2;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  local_1a0 = (undefined1  [8])this->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"// Fail: ",9);
  if (msg == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,msg,sVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  if (this->m_result != QP_TEST_RESULT_PASS) {
    msg = "Multiple problems, see log for details";
    bVar2 = result != QP_TEST_RESULT_FAIL;
    result = QP_TEST_RESULT_FAIL;
    if (bVar2) goto LAB_01800fe5;
  }
  this->m_result = result;
LAB_01800fe5:
  this->m_message = msg;
  return;
}

Assistant:

void ResultCollector::addResult (qpTestResult result, const char* msg)
{
	m_log << TestLog::Message << "// Fail: " << msg << TestLog::EndMessage;
	if (m_result == QP_TEST_RESULT_PASS)
	{
		m_result = result;
		m_message = msg;
	}
	else
	{
		if (result == QP_TEST_RESULT_FAIL)
			m_result = result;
		m_message = "Multiple problems, see log for details";
	}
}